

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O1

void mapVoronoiZoom(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  void *__ptr;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  ulong uVar34;
  uint uVar35;
  int iVar36;
  long lVar37;
  void *__src;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  
  uVar15 = (int)areaX - 2;
  uVar35 = (int)areaZ - 2;
  iVar16 = (int)uVar15 >> 2;
  iVar36 = (int)uVar35 >> 2;
  iVar2 = areaWidth >> 2;
  iVar3 = iVar2 + 2;
  uVar17 = areaWidth & 0xfffffffc;
  iVar19 = areaHeight >> 2;
  iVar33 = uVar17 + 4;
  __ptr = malloc((long)(int)(((areaHeight & 0xfffffffcU) + 5) * (uVar17 + 5)) << 2);
  (*l->p->getMap)(l->p,out,(long)iVar16,(long)iVar36,iVar3,iVar19 + 2);
  if (-1 < iVar19) {
    iVar27 = 0;
    uVar34 = 0;
    do {
      uVar22 = uVar34 + 1;
      if (-1 < iVar2) {
        iVar4 = (int)uVar34 + iVar36;
        lVar13 = (long)(iVar4 * 4);
        lVar1 = l->worldSeed;
        lVar23 = (lVar1 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar1;
        lVar11 = (long)(iVar4 * 4 + 4);
        uVar18 = 0;
        uVar29 = out[uVar22 * (long)iVar3];
        uVar31 = out[uVar34 * (long)iVar3];
        iVar4 = iVar27;
        do {
          iVar5 = iVar16 + (int)uVar18;
          lVar14 = (long)(iVar5 * 4);
          lVar37 = lVar23 + lVar14;
          lVar37 = (lVar37 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar37;
          lVar20 = lVar37 + lVar13;
          lVar20 = (lVar20 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar20 + lVar14;
          lVar20 = (lVar20 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar20 + lVar13;
          uVar24 = (int)((ulong)lVar20 >> 0x18) % 0x400;
          lVar20 = (lVar20 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar20 + lVar1;
          uVar25 = (uint)((ulong)lVar20 >> 0x18);
          uVar6 = uVar25 + 0x3ff;
          if (-1 < lVar20 >> 0x18) {
            uVar6 = uVar25;
          }
          uVar25 = uVar25 - (uVar6 & 0xfffffc00);
          lVar28 = (long)(iVar5 * 4 + 4);
          lVar20 = lVar23 + lVar28;
          lVar20 = (lVar20 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar20;
          lVar21 = lVar20 + lVar13;
          lVar21 = (lVar21 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar21 + lVar28;
          lVar21 = (lVar21 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar21 + lVar13;
          uVar6 = (uint)((ulong)lVar21 >> 0x18);
          uVar7 = uVar6 + 0x3ff;
          if (-1 < lVar21 >> 0x18) {
            uVar7 = uVar6;
          }
          uVar6 = uVar6 - (uVar7 & 0xfffffc00);
          lVar21 = (lVar21 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar21 + lVar1;
          uVar7 = (uint)((ulong)lVar21 >> 0x18);
          uVar8 = uVar7 + 0x3ff;
          if (-1 < lVar21 >> 0x18) {
            uVar8 = uVar7;
          }
          uVar7 = uVar7 - (uVar8 & 0xfffffc00);
          lVar37 = lVar37 + lVar11;
          lVar14 = (lVar37 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar37 + lVar14;
          lVar37 = (lVar14 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar14 + lVar11;
          uVar8 = (uint)((ulong)lVar37 >> 0x18);
          uVar9 = uVar8 + 0x3ff;
          if (-1 < lVar37 >> 0x18) {
            uVar9 = uVar8;
          }
          uVar8 = uVar8 - (uVar9 & 0xfffffc00);
          lVar37 = (lVar37 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar37 + lVar1;
          uVar9 = (uint)((ulong)lVar37 >> 0x18);
          uVar12 = uVar9 + 0x3ff;
          if (-1 < lVar37 >> 0x18) {
            uVar12 = uVar9;
          }
          uVar9 = uVar9 - (uVar12 & 0xfffffc00);
          lVar20 = lVar20 + lVar11;
          lVar28 = (lVar20 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar20 + lVar28;
          lVar37 = (lVar28 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar28 + lVar11;
          uVar12 = (uint)((ulong)lVar37 >> 0x18);
          uVar10 = uVar12 + 0x3ff;
          if (-1 < lVar37 >> 0x18) {
            uVar10 = uVar12;
          }
          uVar12 = uVar12 - (uVar10 & 0xfffffc00);
          lVar37 = (lVar37 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar37 + lVar1;
          uVar10 = (uint)((ulong)lVar37 >> 0x18);
          uVar30 = uVar10 + 0x3ff;
          if (-1 < lVar37 >> 0x18) {
            uVar30 = uVar10;
          }
          uVar10 = uVar10 - (uVar30 & 0xfffffc00);
          uVar32 = (uint)(byte)(out + uVar34 * (long)iVar3)[uVar18 + 1];
          uVar30 = (uint)(byte)(out + uVar22 * (long)iVar3)[uVar18 + 1];
          uVar18 = uVar18 + 1;
          iVar26 = 0;
          dVar43 = 0.0;
          iVar5 = iVar4;
          do {
            dVar38 = dVar43 - ((double)(int)((uVar25 & 0x400) + uVar25) * 0.0009765625 + -0.5) * 3.6
            ;
            dVar39 = dVar43 - ((double)(int)((uVar7 & 0x400) + uVar7) * 0.0009765625 + -0.5) * 3.6;
            dVar41 = dVar43 - (((double)(int)((uVar9 & 0x400) + uVar9) * 0.0009765625 + -0.5) * 3.6
                              + 4.0);
            dVar42 = dVar43 - (((double)(int)((uVar10 & 0x400) + uVar10) * 0.0009765625 + -0.5) *
                               3.6 + 4.0);
            lVar20 = 0;
            dVar44 = 0.0;
            do {
              dVar40 = dVar44 - ((double)(int)((uVar24 & 0x400) + uVar24) * 0.0009765625 + -0.5) *
                                3.6;
              dVar46 = dVar38 * dVar38 + dVar40 * dVar40;
              dVar40 = dVar44 - (((double)(int)((uVar6 & 0x400) + uVar6) * 0.0009765625 + -0.5) *
                                 3.6 + 4.0);
              dVar47 = dVar39 * dVar39 + dVar40 * dVar40;
              dVar40 = dVar44 - ((double)(int)((uVar8 & 0x400) + uVar8) * 0.0009765625 + -0.5) * 3.6
              ;
              dVar45 = dVar41 * dVar41 + dVar40 * dVar40;
              dVar40 = dVar44 - (((double)(int)((uVar12 & 0x400) + uVar12) * 0.0009765625 + -0.5) *
                                 3.6 + 4.0);
              dVar40 = dVar42 * dVar42 + dVar40 * dVar40;
              if (((dVar47 <= dVar46) || (dVar45 <= dVar46)) || (dVar40 <= dVar46)) {
                if (((dVar46 <= dVar47) || (dVar45 <= dVar47)) || (dVar40 <= dVar47)) {
                  if (((dVar46 <= dVar45) || (dVar47 <= dVar45)) || (dVar40 <= dVar45)) {
                    *(uint *)((long)__ptr + lVar20 * 4 + (long)iVar5 * 4) = uVar30;
                  }
                  else {
                    *(uint *)((long)__ptr + lVar20 * 4 + (long)iVar5 * 4) = uVar29;
                  }
                }
                else {
                  *(uint *)((long)__ptr + lVar20 * 4 + (long)iVar5 * 4) = uVar32;
                }
              }
              else {
                *(uint *)((long)__ptr + lVar20 * 4 + (long)iVar5 * 4) = uVar31;
              }
              dVar44 = dVar44 + 1.0;
              lVar20 = lVar20 + 1;
            } while ((int)lVar20 != 4);
            dVar43 = dVar43 + 1.0;
            iVar26 = iVar26 + 1;
            iVar5 = iVar5 + iVar33;
          } while (iVar26 != 4);
          iVar4 = iVar4 + 4;
          uVar29 = uVar30;
          uVar31 = uVar32;
        } while (uVar18 != iVar2 + 1);
        l->chunkSeed = (lVar37 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar37 + lVar1;
      }
      iVar27 = iVar27 + uVar17 * 4 + 0x10;
      uVar34 = uVar22;
    } while (uVar22 != iVar19 + 1);
  }
  if (0 < areaHeight) {
    uVar34 = (ulong)(uint)areaHeight;
    __src = (void *)(((ulong)(uVar35 & 3) * (long)iVar33 + (ulong)(uVar15 & 3)) * 4 + (long)__ptr);
    do {
      memcpy(out,__src,(long)areaWidth * 4);
      out = out + areaWidth;
      __src = (void *)((long)__src + (long)iVar33 * 4);
      uVar34 = uVar34 - 1;
    } while (uVar34 != 0);
  }
  free(__ptr);
  return;
}

Assistant:

void mapVoronoiZoom(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    areaX -= 2;
    areaZ -= 2;
    int pX = (int) areaX >> 2;
    int pZ = (int) areaZ >> 2;
    int pWidth = (areaWidth >> 2) + 2;
    int pHeight = (areaHeight >> 2) + 2;
    int newWidth = (pWidth - 1) << 2;
    int newHeight = (pHeight - 1) << 2;
    int x, z, i, j;
    int *buf = (int *) malloc((newWidth + 1) * (newHeight + 1) * sizeof(*buf));

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    for (z = 0; z < pHeight - 1; z++) {
        int v00 = out[(z + 0) * pWidth];
        int v01 = out[(z + 1) * pWidth];

        for (x = 0; x < pWidth - 1; x++) {
            setChunkSeed(l, (x + pX) << 2, (z + pZ) << 2);
            double da1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;
            double da2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;

            setChunkSeed(l, (x + pX + 1) << 2, (z + pZ) << 2);
            double db1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;
            double db2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;

            setChunkSeed(l, (x + pX) << 2, (z + pZ + 1) << 2);
            double dc1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6;
            double dc2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;

            setChunkSeed(l, (x + pX + 1) << 2, (z + pZ + 1) << 2);
            double dd1 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;
            double dd2 = (mcNextInt(l, 1024) / 1024.0 - 0.5) * 3.6 + 4.0;

            int v10 = out[x + 1 + (z + 0) * pWidth] & 255;
            int v11 = out[x + 1 + (z + 1) * pWidth] & 255;

            for (j = 0; j < 4; j++) {
                int idx = ((z << 2) + j) * newWidth + (x << 2);

                for (i = 0; i < 4; i++) {
                    double da = (j - da2) * (j - da2) + (i - da1) * (i - da1);
                    double db = (j - db2) * (j - db2) + (i - db1) * (i - db1);
                    double dc = (j - dc2) * (j - dc2) + (i - dc1) * (i - dc1);
                    double dd = (j - dd2) * (j - dd2) + (i - dd1) * (i - dd1);

                    if (da < db && da < dc && da < dd) {
                        buf[idx++] = v00;
                    } else if (db < da && db < dc && db < dd) {
                        buf[idx++] = v10;
                    } else if (dc < da && dc < db && dc < dd) {
                        buf[idx++] = v01;
                    } else {
                        buf[idx++] = v11;
                    }
                }
            }

            v00 = v10;
            v01 = v11;
        }
    }

    for (z = 0; z < areaHeight; z++) {
        memcpy(&out[z * areaWidth], &buf[(z + (areaZ & 3)) * newWidth + (areaX & 3)], areaWidth * sizeof(int));
    }

    free(buf);
}